

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O2

void kj::anon_unknown_0::testHttpServerRequest
               (WaitScope *waitScope,Timer *timer,HttpRequestTestCase *requestCase,
               HttpResponseTestCase *responseCase,TwoWayPipe *pipe)

{
  AsyncIoStream *pAVar1;
  Settings settings;
  StringPtr expected;
  Own<kj::_::PromiseNode> local_1f8;
  Promise<void> listenTask;
  Own<kj::AsyncIoStream> local_1d8;
  anon_union_16_2_a774ebf0_for_OneOf<kj::HttpService_*,_kj::Function<kj::Own<kj::HttpService>_(kj::AsyncIoStream_&)>_>_3
  local_1c8;
  Duration local_1b8;
  Duration DStack_1b0;
  HttpHeaderTable table;
  TestHttpService service;
  HttpServer server;
  
  HttpHeaderTable::HttpHeaderTable(&table);
  service.super_HttpService._vptr_HttpService = (_func_int **)&PTR_request_00423dd0;
  service.testCases.ptr = (HttpTestCase *)0x0;
  service.testCases.size_ = 0;
  service.singleExpectedRequest = requestCase;
  service.singleResponse = responseCase;
  HttpHeaders::HttpHeaders(&service.responseHeaders,&table);
  service.requestCount = 0;
  local_1c8.forceAligned = (void *)0x37e11d600;
  local_1c8._8_8_ = 5000000000;
  local_1b8.value = 1000000000;
  DStack_1b0.value = 0x10000;
  settings.pipelineTimeout.value = 5000000000;
  settings.headerTimeout.value = 15000000000;
  settings.canceledUploadGacePeriod.value = 1000000000;
  settings.canceledUploadGraceBytes = 0x10000;
  HttpServer::HttpServer(&server,timer,&table,&service.super_HttpService,settings);
  local_1d8.disposer = pipe->ends[0].disposer;
  local_1d8.ptr = pipe->ends[0].ptr;
  pipe->ends[0].ptr = (AsyncIoStream *)0x0;
  HttpServer::listenHttp((HttpServer *)&listenTask,(Own<kj::AsyncIoStream> *)&server);
  Own<kj::AsyncIoStream>::dispose(&local_1d8);
  pAVar1 = pipe->ends[1].ptr;
  (**(pAVar1->super_AsyncOutputStream)._vptr_AsyncOutputStream)
            (&local_1f8,&pAVar1->super_AsyncOutputStream,(requestCase->raw).content.ptr,
             (requestCase->raw).content.size_ - 1);
  Promise<void>::wait((Promise<void> *)&local_1f8,waitScope);
  Own<kj::_::PromiseNode>::dispose(&local_1f8);
  (*((pipe->ends[1].ptr)->super_AsyncInputStream)._vptr_AsyncInputStream[4])();
  expected.content.size_ = (size_t)(responseCase->raw).content.ptr;
  expected.content.ptr = (char *)pipe->ends[1].ptr;
  expectRead((AsyncInputStream *)&local_1f8,expected);
  Promise<void>::wait((Promise<void> *)&local_1f8,waitScope);
  Own<kj::_::PromiseNode>::dispose(&local_1f8);
  Promise<void>::wait(&listenTask,waitScope);
  if ((service.requestCount != 1) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[48]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x287,ERROR,"\"failed: expected \" \"service.getRequestCount() == 1\"",
               (char (*) [48])"failed: expected service.getRequestCount() == 1");
  }
  Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&listenTask);
  HttpServer::~HttpServer(&server);
  HttpHeaders::~HttpHeaders(&service.responseHeaders);
  HttpHeaderTable::~HttpHeaderTable(&table);
  return;
}

Assistant:

void testHttpServerRequest(kj::WaitScope& waitScope, kj::Timer& timer,
                           const HttpRequestTestCase& requestCase,
                           const HttpResponseTestCase& responseCase,
                           kj::TwoWayPipe pipe) {
  HttpHeaderTable table;
  TestHttpService service(requestCase, responseCase, table);
  HttpServer server(timer, table, service);

  auto listenTask = server.listenHttp(kj::mv(pipe.ends[0]));

  pipe.ends[1]->write(requestCase.raw.begin(), requestCase.raw.size()).wait(waitScope);
  pipe.ends[1]->shutdownWrite();

  expectRead(*pipe.ends[1], responseCase.raw).wait(waitScope);

  listenTask.wait(waitScope);

  KJ_EXPECT(service.getRequestCount() == 1);
}